

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

StreamIn * prvTidyFileInput(TidyDocImpl *doc,FILE *fp,int encoding)

{
  int iVar1;
  StreamIn *in;
  int encoding_local;
  FILE *fp_local;
  TidyDocImpl *doc_local;
  
  doc_local = (TidyDocImpl *)prvTidyinitStreamIn(doc,encoding);
  iVar1 = prvTidyinitFileSource
                    (doc->allocator,(TidyInputSource *)((doc_local->config).value + 0x18),fp);
  if (iVar1 == 0) {
    *(IOType *)((long)(doc_local->config).value + 0xbc) = FileIO;
  }
  else {
    prvTidyfreeStreamIn((StreamIn *)doc_local);
    doc_local = (TidyDocImpl *)0x0;
  }
  return (StreamIn *)doc_local;
}

Assistant:

StreamIn* TY_(FileInput)( TidyDocImpl* doc, FILE *fp, int encoding )
{
    StreamIn *in = TY_(initStreamIn)( doc, encoding );
    if ( TY_(initFileSource)( doc->allocator, &in->source, fp ) != 0 )
    {
        TY_(freeStreamIn)( in );
        return NULL;
    }
    in->iotype = FileIO;
    return in;
}